

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNeuron.cpp
# Opt level: O3

void __thiscall BasicNeuron::BasicNeuron(BasicNeuron *this)

{
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_50;
  
  INeuron::INeuron(&this->super_INeuron,0.0,0.01,true);
  *(undefined ***)this = &PTR_ProcessInputSpike_00105cb8;
  local_50._M_bucket_count = 1;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = 0;
  local_50._M_rehash_policy._M_max_load_factor = 1.0;
  local_50._M_rehash_policy._4_4_ = 0;
  local_50._M_rehash_policy._M_next_resize = 0;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  local_50._M_buckets = &local_50._M_single_bucket;
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign((_Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&this->field_0x80,&local_50);
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_50);
  local_50._M_bucket_count = 1;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = 0;
  local_50._M_rehash_policy._M_max_load_factor = 1.0;
  local_50._M_rehash_policy._4_4_ = 0;
  local_50._M_rehash_policy._M_next_resize = 0;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  local_50._M_buckets = &local_50._M_single_bucket;
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign((_Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&this->field_0x48,&local_50);
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_50);
  *(undefined4 *)&this->field_0xbc = 0;
  *(undefined4 *)&this->field_0xc4 = 0;
  this->field_0xc8 = 1;
  this->grad = 0.0;
  *(undefined8 *)&this->field_0xcc = 0;
  return;
}

Assistant:

BasicNeuron::BasicNeuron()
{
    outputSynapses = std::unordered_set<ISynapse *>();
    inputSynapses = std::unordered_set<ISynapse *>();
    potential = 0;
    tRef = 0;
    consistent = true;
    grad = 0;
    inputSpikeCounter = 0;
    outputSpikeCounter = 0;
}